

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenuSloppyState::enter(QMenuSloppyState *this)

{
  QMenuPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  QObject *menu;
  
  if ((this->field_0x6c & 8) != 0) {
    this_00 = *(QMenuPrivate **)&(this->m_menu->super_QWidget).field_0x8;
    bVar2 = comparesEqual<QMenu>(&this->m_sub_menu,&this_00->activeMenu);
    if (bVar2) {
      pDVar1 = (this->m_sub_menu).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        menu = (QObject *)0x0;
      }
      else {
        menu = (this->m_sub_menu).wp.value;
      }
      QMenuPrivate::hideMenu(this_00,(QMenu *)menu);
      reset(this);
    }
  }
  if (this->m_parent != (QMenuSloppyState *)0x0) {
    childEnter(this->m_parent);
    return;
  }
  return;
}

Assistant:

void QMenuSloppyState::enter()
{
    QMenuPrivate *menuPriv = QMenuPrivate::get(m_menu);

    if (m_discard_state_when_entering_parent && m_sub_menu == menuPriv->activeMenu) {
        menuPriv->hideMenu(m_sub_menu);
        reset();
    }
    if (m_parent)
        m_parent->childEnter();
}